

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSubstGroupFree(xmlSchemaSubstGroupPtr group)

{
  xmlSchemaSubstGroupPtr group_local;
  
  if (group != (xmlSchemaSubstGroupPtr)0x0) {
    if (group->members != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaItemListFree(group->members);
    }
    (*xmlFree)(group);
  }
  return;
}

Assistant:

static void
xmlSchemaSubstGroupFree(xmlSchemaSubstGroupPtr group)
{
    if (group == NULL)
	return;
    if (group->members != NULL)
	xmlSchemaItemListFree(group->members);
    xmlFree(group);
}